

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack8.h
# Opt level: O2

void ncnn::conv3x3s1_winograd63_transform_input_pack8_avx
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  float *pfVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  int j;
  ulong uVar32;
  undefined1 (*pauVar33) [32];
  ulong uVar34;
  long lVar35;
  uint uVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  float fVar51;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  float fVar64;
  float fVar65;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar75;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar76 [32];
  undefined1 auVar83 [32];
  float fVar86;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float tmp [8] [8] [8];
  long local_8f0;
  float afStack_860 [8];
  undefined1 auStack_840 [32];
  undefined1 auStack_820 [32];
  undefined1 auStack_800 [32];
  undefined1 auStack_7e0 [32];
  undefined1 auStack_7c0 [32];
  undefined1 auStack_7a0 [32];
  undefined1 auStack_780 [32];
  float afStack_760 [64];
  undefined1 auStack_660 [256];
  undefined1 auStack_560 [256];
  undefined1 auStack_460 [256];
  float afStack_360 [128];
  float afStack_160 [76];
  
  iVar2 = bottom_blob->w;
  uVar36 = (iVar2 + -2) / 6;
  uVar26 = (long)(bottom_blob->h + -2) / 6;
  iVar25 = (int)uVar26;
  iVar29 = iVar25 * uVar36;
  uVar39 = 0;
  uVar30 = 0;
  if (0 < (int)uVar36) {
    uVar30 = (ulong)uVar36;
  }
  uVar26 = uVar26 & 0xffffffff;
  if (iVar25 < 1) {
    uVar26 = uVar39;
  }
  uVar31 = (ulong)(uint)bottom_blob->c;
  if (bottom_blob->c < 1) {
    uVar31 = uVar39;
  }
  for (; uVar39 != uVar31; uVar39 = uVar39 + 1) {
    iVar25 = bottom_blob->w;
    sVar3 = bottom_blob->elemsize;
    lVar35 = bottom_blob_tm->cstep * bottom_blob_tm->elemsize * uVar39;
    pvVar4 = bottom_blob_tm->data;
    local_8f0 = (long)bottom_blob->data + bottom_blob->cstep * sVar3 * uVar39 + 0xe0;
    lVar28 = 0;
    for (uVar34 = 0; uVar34 != uVar26; uVar34 = uVar34 + 1) {
      lVar27 = lVar28;
      for (uVar32 = 0; uVar32 != uVar30; uVar32 = uVar32 + 1) {
        pauVar33 = (undefined1 (*) [32])(((long)(uVar32 * 0x3000000000) >> 0x1e) + local_8f0);
        for (lVar37 = -0x100; lVar37 != 0; lVar37 = lVar37 + 0x20) {
          auVar66 = pauVar33[-6];
          auVar44 = pauVar33[-5];
          auVar62 = pauVar33[-4];
          auVar63 = pauVar33[-3];
          auVar67 = pauVar33[-2];
          auVar41 = pauVar33[-1];
          auVar21 = vsubps_avx(auVar63,auVar44);
          auVar22 = vsubps_avx(pauVar33[-7],auVar41);
          auVar23 = vsubps_avx(auVar62,auVar67);
          auVar24 = vsubps_avx(*pauVar33,auVar66);
          fVar86 = auVar24._28_4_;
          fVar5 = auVar41._0_4_;
          fVar55 = auVar44._0_4_;
          fVar7 = auVar41._4_4_;
          fVar56 = auVar44._4_4_;
          fVar9 = auVar41._8_4_;
          fVar57 = auVar44._8_4_;
          fVar11 = auVar41._12_4_;
          fVar58 = auVar44._12_4_;
          fVar13 = auVar41._16_4_;
          fVar59 = auVar44._16_4_;
          fVar15 = auVar41._20_4_;
          fVar60 = auVar44._20_4_;
          fVar17 = auVar41._24_4_;
          fVar64 = auVar44._24_4_;
          fVar19 = auVar41._28_4_;
          auVar40._0_4_ = auVar63._0_4_ * -4.25 + fVar55 + fVar5;
          auVar40._4_4_ = auVar63._4_4_ * -4.25 + fVar56 + fVar7;
          auVar40._8_4_ = auVar63._8_4_ * -4.25 + fVar57 + fVar9;
          auVar40._12_4_ = auVar63._12_4_ * -4.25 + fVar58 + fVar11;
          auVar40._16_4_ = auVar63._16_4_ * -4.25 + fVar59 + fVar13;
          auVar40._20_4_ = auVar63._20_4_ * -4.25 + fVar60 + fVar15;
          auVar40._24_4_ = auVar63._24_4_ * -4.25 + fVar64 + fVar17;
          auVar40._28_4_ = fVar86 + auVar44._28_4_ + fVar19;
          fVar6 = auVar66._0_4_;
          fVar74 = auVar67._0_4_;
          fVar8 = auVar66._4_4_;
          fVar45 = auVar67._4_4_;
          fVar10 = auVar66._8_4_;
          fVar46 = auVar67._8_4_;
          fVar12 = auVar66._12_4_;
          fVar47 = auVar67._12_4_;
          fVar14 = auVar66._16_4_;
          fVar48 = auVar67._16_4_;
          fVar16 = auVar66._20_4_;
          fVar49 = auVar67._20_4_;
          fVar18 = auVar66._24_4_;
          fVar50 = auVar67._24_4_;
          fVar20 = auVar66._28_4_;
          fVar51 = auVar67._28_4_;
          auVar42._0_4_ = auVar62._0_4_ * -4.25 + fVar74 + fVar6;
          auVar42._4_4_ = auVar62._4_4_ * -4.25 + fVar45 + fVar8;
          auVar42._8_4_ = auVar62._8_4_ * -4.25 + fVar46 + fVar10;
          auVar42._12_4_ = auVar62._12_4_ * -4.25 + fVar47 + fVar12;
          auVar42._16_4_ = auVar62._16_4_ * -4.25 + fVar48 + fVar14;
          auVar42._20_4_ = auVar62._20_4_ * -4.25 + fVar49 + fVar16;
          auVar42._24_4_ = auVar62._24_4_ * -4.25 + fVar50 + fVar18;
          auVar42._28_4_ = fVar86 + fVar51 + fVar20;
          auVar84._0_4_ = auVar40._0_4_ + auVar42._0_4_;
          auVar84._4_4_ = auVar40._4_4_ + auVar42._4_4_;
          auVar84._8_4_ = auVar40._8_4_ + auVar42._8_4_;
          auVar84._12_4_ = auVar40._12_4_ + auVar42._12_4_;
          auVar84._16_4_ = auVar40._16_4_ + auVar42._16_4_;
          auVar84._20_4_ = auVar40._20_4_ + auVar42._20_4_;
          auVar84._24_4_ = auVar40._24_4_ + auVar42._24_4_;
          auVar84._28_4_ = auVar40._28_4_ + auVar42._28_4_;
          auVar66 = vsubps_avx(auVar40,auVar42);
          fVar75 = auVar63._0_4_ * -1.25;
          fVar77 = auVar63._4_4_ * -1.25;
          fVar78 = auVar63._8_4_ * -1.25;
          fVar79 = auVar63._12_4_ * -1.25;
          fVar80 = auVar63._16_4_ * -1.25;
          fVar81 = auVar63._20_4_ * -1.25;
          fVar82 = auVar63._24_4_ * -1.25;
          auVar43._0_4_ = fVar5 + fVar75 + fVar55 * 0.25;
          auVar43._4_4_ = fVar7 + fVar77 + fVar56 * 0.25;
          auVar43._8_4_ = fVar9 + fVar78 + fVar57 * 0.25;
          auVar43._12_4_ = fVar11 + fVar79 + fVar58 * 0.25;
          auVar43._16_4_ = fVar13 + fVar80 + fVar59 * 0.25;
          auVar43._20_4_ = fVar15 + fVar81 + fVar60 * 0.25;
          auVar43._24_4_ = fVar17 + fVar82 + fVar64 * 0.25;
          auVar43._28_4_ = fVar19 + auVar63._28_4_ + 0.25;
          fVar65 = auVar62._0_4_ * -2.5;
          fVar68 = auVar62._4_4_ * -2.5;
          fVar69 = auVar62._8_4_ * -2.5;
          fVar70 = auVar62._12_4_ * -2.5;
          fVar71 = auVar62._16_4_ * -2.5;
          fVar72 = auVar62._20_4_ * -2.5;
          fVar73 = auVar62._24_4_ * -2.5;
          auVar52._0_4_ = fVar65 + fVar6 * 0.5 + fVar74 + fVar74;
          auVar52._4_4_ = fVar68 + fVar8 * 0.5 + fVar45 + fVar45;
          auVar52._8_4_ = fVar69 + fVar10 * 0.5 + fVar46 + fVar46;
          auVar52._12_4_ = fVar70 + fVar12 * 0.5 + fVar47 + fVar47;
          auVar52._16_4_ = fVar71 + fVar14 * 0.5 + fVar48 + fVar48;
          auVar52._20_4_ = fVar72 + fVar16 * 0.5 + fVar49 + fVar49;
          auVar52._24_4_ = fVar73 + fVar18 * 0.5 + fVar50 + fVar50;
          auVar52._28_4_ = auVar62._28_4_ + -1.25 + fVar51 + fVar51;
          auVar61._0_4_ = auVar43._0_4_ + auVar52._0_4_;
          auVar61._4_4_ = auVar43._4_4_ + auVar52._4_4_;
          auVar61._8_4_ = auVar43._8_4_ + auVar52._8_4_;
          auVar61._12_4_ = auVar43._12_4_ + auVar52._12_4_;
          auVar61._16_4_ = auVar43._16_4_ + auVar52._16_4_;
          auVar61._20_4_ = auVar43._20_4_ + auVar52._20_4_;
          auVar61._24_4_ = auVar43._24_4_ + auVar52._24_4_;
          auVar61._28_4_ = auVar43._28_4_ + auVar52._28_4_;
          auVar67 = vsubps_avx(auVar43,auVar52);
          auVar53._0_4_ = fVar5 + (fVar75 + fVar55) * 4.0;
          auVar53._4_4_ = fVar7 + (fVar77 + fVar56) * 4.0;
          auVar53._8_4_ = fVar9 + (fVar78 + fVar57) * 4.0;
          auVar53._12_4_ = fVar11 + (fVar79 + fVar58) * 4.0;
          auVar53._16_4_ = fVar13 + (fVar80 + fVar59) * 4.0;
          auVar53._20_4_ = fVar15 + (fVar81 + fVar60) * 4.0;
          auVar53._24_4_ = fVar17 + (fVar82 + fVar64) * 4.0;
          auVar53._28_4_ = fVar19 + auVar63._28_4_ + auVar44._28_4_;
          auVar63._0_4_ = fVar74 * 0.5 + fVar65 + fVar6 + fVar6;
          auVar63._4_4_ = fVar45 * 0.5 + fVar68 + fVar8 + fVar8;
          auVar63._8_4_ = fVar46 * 0.5 + fVar69 + fVar10 + fVar10;
          auVar63._12_4_ = fVar47 * 0.5 + fVar70 + fVar12 + fVar12;
          auVar63._16_4_ = fVar48 * 0.5 + fVar71 + fVar14 + fVar14;
          auVar63._20_4_ = fVar49 * 0.5 + fVar72 + fVar16 + fVar16;
          auVar63._24_4_ = fVar50 * 0.5 + fVar73 + fVar18 + fVar18;
          auVar63._28_4_ = fVar51 + auVar62._28_4_ + fVar20 + fVar20;
          auVar44 = vsubps_avx(auVar53,auVar63);
          *(float *)((long)afStack_760 + lVar37) = auVar22._0_4_ + auVar21._0_4_ * 5.25;
          *(float *)((long)afStack_760 + lVar37 + 4) = auVar22._4_4_ + auVar21._4_4_ * 5.25;
          *(float *)((long)afStack_760 + lVar37 + 8) = auVar22._8_4_ + auVar21._8_4_ * 5.25;
          *(float *)((long)afStack_760 + lVar37 + 0xc) = auVar22._12_4_ + auVar21._12_4_ * 5.25;
          *(float *)((long)afStack_760 + lVar37 + 0x10) = auVar22._16_4_ + auVar21._16_4_ * 5.25;
          *(float *)((long)afStack_760 + lVar37 + 0x14) = auVar22._20_4_ + auVar21._20_4_ * 5.25;
          *(float *)((long)afStack_760 + lVar37 + 0x18) = auVar22._24_4_ + auVar21._24_4_ * 5.25;
          *(float *)((long)afStack_760 + lVar37 + 0x1c) = auVar22._28_4_ + auVar21._28_4_;
          *(undefined1 (*) [32])(auStack_660 + lVar37) = auVar84;
          *(undefined1 (*) [32])(auStack_560 + lVar37) = auVar66;
          *(undefined1 (*) [32])(auStack_460 + lVar37) = auVar61;
          *(undefined1 (*) [32])((long)afStack_360 + lVar37) = auVar67;
          *(float *)((long)afStack_360 + lVar37 + 0x100) = auVar53._0_4_ + auVar63._0_4_;
          *(float *)((long)afStack_360 + lVar37 + 0x104) = auVar53._4_4_ + auVar63._4_4_;
          *(float *)((long)afStack_360 + lVar37 + 0x108) = auVar53._8_4_ + auVar63._8_4_;
          *(float *)((long)afStack_360 + lVar37 + 0x10c) = auVar53._12_4_ + auVar63._12_4_;
          *(float *)((long)afStack_360 + lVar37 + 0x110) = auVar53._16_4_ + auVar63._16_4_;
          *(float *)((long)afStack_360 + lVar37 + 0x114) = auVar53._20_4_ + auVar63._20_4_;
          *(float *)((long)afStack_360 + lVar37 + 0x118) = auVar53._24_4_ + auVar63._24_4_;
          *(float *)((long)afStack_360 + lVar37 + 0x11c) = auVar53._28_4_ + auVar63._28_4_;
          *(undefined1 (*) [32])((long)afStack_160 + lVar37) = auVar44;
          *(float *)((long)afStack_160 + lVar37 + 0x100) = auVar24._0_4_ + auVar23._0_4_ * 5.25;
          *(float *)((long)afStack_160 + lVar37 + 0x104) = auVar24._4_4_ + auVar23._4_4_ * 5.25;
          *(float *)((long)afStack_160 + lVar37 + 0x108) = auVar24._8_4_ + auVar23._8_4_ * 5.25;
          *(float *)((long)afStack_160 + lVar37 + 0x10c) = auVar24._12_4_ + auVar23._12_4_ * 5.25;
          *(float *)((long)afStack_160 + lVar37 + 0x110) = auVar24._16_4_ + auVar23._16_4_ * 5.25;
          *(float *)((long)afStack_160 + lVar37 + 0x114) = auVar24._20_4_ + auVar23._20_4_ * 5.25;
          *(float *)((long)afStack_160 + lVar37 + 0x118) = auVar24._24_4_ + auVar23._24_4_ * 5.25;
          *(float *)((long)afStack_160 + lVar37 + 0x11c) = fVar86 + auVar23._28_4_;
          pauVar33 = (undefined1 (*) [32])(*pauVar33 + (long)(iVar2 << 3) * 4);
        }
        lVar37 = lVar27;
        for (lVar38 = 0; lVar38 != 0x800; lVar38 = lVar38 + 0x100) {
          auVar66 = *(undefined1 (*) [32])(auStack_840 + lVar38);
          auVar44 = *(undefined1 (*) [32])(auStack_820 + lVar38);
          auVar62 = *(undefined1 (*) [32])(auStack_800 + lVar38);
          auVar63 = *(undefined1 (*) [32])(auStack_7e0 + lVar38);
          auVar67 = *(undefined1 (*) [32])(auStack_7c0 + lVar38);
          auVar41 = *(undefined1 (*) [32])(auStack_7a0 + lVar38);
          auVar21 = vsubps_avx(auVar63,auVar44);
          auVar22 = vsubps_avx(*(undefined1 (*) [32])((long)afStack_860 + lVar38),auVar41);
          auVar23 = vsubps_avx(auVar62,auVar67);
          auVar24 = vsubps_avx(*(undefined1 (*) [32])(auStack_780 + lVar38),auVar66);
          fVar5 = auVar41._0_4_;
          fVar75 = auVar44._0_4_;
          fVar7 = auVar41._4_4_;
          fVar77 = auVar44._4_4_;
          fVar9 = auVar41._8_4_;
          fVar78 = auVar44._8_4_;
          fVar11 = auVar41._12_4_;
          fVar79 = auVar44._12_4_;
          fVar13 = auVar41._16_4_;
          fVar80 = auVar44._16_4_;
          fVar15 = auVar41._20_4_;
          fVar81 = auVar44._20_4_;
          fVar17 = auVar41._24_4_;
          fVar82 = auVar44._24_4_;
          fVar19 = auVar41._28_4_;
          fVar74 = auVar44._28_4_ + fVar19;
          auVar41._0_4_ = fVar75 + fVar5 + auVar63._0_4_ * -4.25;
          auVar41._4_4_ = fVar77 + fVar7 + auVar63._4_4_ * -4.25;
          auVar41._8_4_ = fVar78 + fVar9 + auVar63._8_4_ * -4.25;
          auVar41._12_4_ = fVar79 + fVar11 + auVar63._12_4_ * -4.25;
          auVar41._16_4_ = fVar80 + fVar13 + auVar63._16_4_ * -4.25;
          auVar41._20_4_ = fVar81 + fVar15 + auVar63._20_4_ * -4.25;
          auVar41._24_4_ = fVar82 + fVar17 + auVar63._24_4_ * -4.25;
          auVar41._28_4_ = fVar74 + auVar23._28_4_;
          fVar6 = auVar66._0_4_;
          fVar64 = auVar67._0_4_;
          fVar8 = auVar66._4_4_;
          fVar65 = auVar67._4_4_;
          fVar10 = auVar66._8_4_;
          fVar68 = auVar67._8_4_;
          fVar12 = auVar66._12_4_;
          fVar69 = auVar67._12_4_;
          fVar14 = auVar66._16_4_;
          fVar70 = auVar67._16_4_;
          fVar16 = auVar66._20_4_;
          fVar71 = auVar67._20_4_;
          fVar18 = auVar66._24_4_;
          fVar72 = auVar67._24_4_;
          fVar20 = auVar66._28_4_;
          fVar73 = auVar67._28_4_;
          auVar66._0_4_ = auVar62._0_4_ * -4.25 + fVar64 + fVar6;
          auVar66._4_4_ = auVar62._4_4_ * -4.25 + fVar65 + fVar8;
          auVar66._8_4_ = auVar62._8_4_ * -4.25 + fVar68 + fVar10;
          auVar66._12_4_ = auVar62._12_4_ * -4.25 + fVar69 + fVar12;
          auVar66._16_4_ = auVar62._16_4_ * -4.25 + fVar70 + fVar14;
          auVar66._20_4_ = auVar62._20_4_ * -4.25 + fVar71 + fVar16;
          auVar66._24_4_ = auVar62._24_4_ * -4.25 + fVar72 + fVar18;
          auVar66._28_4_ = fVar74 + fVar73 + fVar20;
          auVar76._0_4_ = auVar66._0_4_ + auVar41._0_4_;
          auVar76._4_4_ = auVar66._4_4_ + auVar41._4_4_;
          auVar76._8_4_ = auVar66._8_4_ + auVar41._8_4_;
          auVar76._12_4_ = auVar66._12_4_ + auVar41._12_4_;
          auVar76._16_4_ = auVar66._16_4_ + auVar41._16_4_;
          auVar76._20_4_ = auVar66._20_4_ + auVar41._20_4_;
          auVar76._24_4_ = auVar66._24_4_ + auVar41._24_4_;
          auVar76._28_4_ = auVar66._28_4_ + auVar41._28_4_;
          auVar66 = vsubps_avx(auVar41,auVar66);
          fVar51 = auVar63._0_4_ * -1.25;
          fVar55 = auVar63._4_4_ * -1.25;
          fVar56 = auVar63._8_4_ * -1.25;
          fVar57 = auVar63._12_4_ * -1.25;
          fVar58 = auVar63._16_4_ * -1.25;
          fVar59 = auVar63._20_4_ * -1.25;
          fVar60 = auVar63._24_4_ * -1.25;
          auVar67._0_4_ = fVar75 * 0.25 + fVar51 + fVar5;
          auVar67._4_4_ = fVar77 * 0.25 + fVar55 + fVar7;
          auVar67._8_4_ = fVar78 * 0.25 + fVar56 + fVar9;
          auVar67._12_4_ = fVar79 * 0.25 + fVar57 + fVar11;
          auVar67._16_4_ = fVar80 * 0.25 + fVar58 + fVar13;
          auVar67._20_4_ = fVar81 * 0.25 + fVar59 + fVar15;
          auVar67._24_4_ = fVar82 * 0.25 + fVar60 + fVar17;
          auVar67._28_4_ = auVar63._28_4_ + 0.25 + fVar19;
          fVar74 = auVar62._0_4_ * -2.5;
          fVar45 = auVar62._4_4_ * -2.5;
          fVar46 = auVar62._8_4_ * -2.5;
          fVar47 = auVar62._12_4_ * -2.5;
          fVar48 = auVar62._16_4_ * -2.5;
          fVar49 = auVar62._20_4_ * -2.5;
          fVar50 = auVar62._24_4_ * -2.5;
          auVar83._0_4_ = fVar6 * 0.5 + fVar74 + fVar64 + fVar64;
          auVar83._4_4_ = fVar8 * 0.5 + fVar45 + fVar65 + fVar65;
          auVar83._8_4_ = fVar10 * 0.5 + fVar46 + fVar68 + fVar68;
          auVar83._12_4_ = fVar12 * 0.5 + fVar47 + fVar69 + fVar69;
          auVar83._16_4_ = fVar14 * 0.5 + fVar48 + fVar70 + fVar70;
          auVar83._20_4_ = fVar16 * 0.5 + fVar49 + fVar71 + fVar71;
          auVar83._24_4_ = fVar18 * 0.5 + fVar50 + fVar72 + fVar72;
          auVar83._28_4_ = auVar62._28_4_ + -1.25 + fVar73 + fVar73;
          auVar85._0_4_ = auVar67._0_4_ + auVar83._0_4_;
          auVar85._4_4_ = auVar67._4_4_ + auVar83._4_4_;
          auVar85._8_4_ = auVar67._8_4_ + auVar83._8_4_;
          auVar85._12_4_ = auVar67._12_4_ + auVar83._12_4_;
          auVar85._16_4_ = auVar67._16_4_ + auVar83._16_4_;
          auVar85._20_4_ = auVar67._20_4_ + auVar83._20_4_;
          auVar85._24_4_ = auVar67._24_4_ + auVar83._24_4_;
          auVar85._28_4_ = auVar67._28_4_ + auVar83._28_4_;
          auVar67 = vsubps_avx(auVar67,auVar83);
          auVar54._0_4_ = (fVar75 + fVar51) * 4.0 + fVar5;
          auVar54._4_4_ = (fVar77 + fVar55) * 4.0 + fVar7;
          auVar54._8_4_ = (fVar78 + fVar56) * 4.0 + fVar9;
          auVar54._12_4_ = (fVar79 + fVar57) * 4.0 + fVar11;
          auVar54._16_4_ = (fVar80 + fVar58) * 4.0 + fVar13;
          auVar54._20_4_ = (fVar81 + fVar59) * 4.0 + fVar15;
          auVar54._24_4_ = (fVar82 + fVar60) * 4.0 + fVar17;
          auVar54._28_4_ = auVar44._28_4_ + auVar63._28_4_ + fVar19;
          auVar44._0_4_ = fVar74 + fVar6 + fVar6 + fVar64 * 0.5;
          auVar44._4_4_ = fVar45 + fVar8 + fVar8 + fVar65 * 0.5;
          auVar44._8_4_ = fVar46 + fVar10 + fVar10 + fVar68 * 0.5;
          auVar44._12_4_ = fVar47 + fVar12 + fVar12 + fVar69 * 0.5;
          auVar44._16_4_ = fVar48 + fVar14 + fVar14 + fVar70 * 0.5;
          auVar44._20_4_ = fVar49 + fVar16 + fVar16 + fVar71 * 0.5;
          auVar44._24_4_ = fVar50 + fVar18 + fVar18 + fVar72 * 0.5;
          auVar44._28_4_ = auVar62._28_4_ + fVar20 + fVar20 + fVar20 + fVar20;
          auVar62._0_4_ = auVar54._0_4_ + auVar44._0_4_;
          auVar62._4_4_ = auVar54._4_4_ + auVar44._4_4_;
          auVar62._8_4_ = auVar54._8_4_ + auVar44._8_4_;
          auVar62._12_4_ = auVar54._12_4_ + auVar44._12_4_;
          auVar62._16_4_ = auVar54._16_4_ + auVar44._16_4_;
          auVar62._20_4_ = auVar54._20_4_ + auVar44._20_4_;
          auVar62._24_4_ = auVar54._24_4_ + auVar44._24_4_;
          auVar62._28_4_ = auVar54._28_4_ + auVar44._28_4_;
          auVar44 = vsubps_avx(auVar54,auVar44);
          pfVar1 = (float *)((long)pvVar4 + lVar37 + lVar35);
          *pfVar1 = auVar21._0_4_ * 5.25 + auVar22._0_4_;
          pfVar1[1] = auVar21._4_4_ * 5.25 + auVar22._4_4_;
          pfVar1[2] = auVar21._8_4_ * 5.25 + auVar22._8_4_;
          pfVar1[3] = auVar21._12_4_ * 5.25 + auVar22._12_4_;
          pfVar1[4] = auVar21._16_4_ * 5.25 + auVar22._16_4_;
          pfVar1[5] = auVar21._20_4_ * 5.25 + auVar22._20_4_;
          pfVar1[6] = auVar21._24_4_ * 5.25 + auVar22._24_4_;
          pfVar1[7] = auVar21._28_4_ + auVar22._28_4_;
          *(undefined1 (*) [32])((long)pvVar4 + lVar37 + (long)(iVar29 * 8) * 4 + lVar35) = auVar76;
          *(undefined1 (*) [32])((long)pvVar4 + lVar37 + (long)(iVar29 * 0x10) * 4 + lVar35) =
               auVar66;
          *(undefined1 (*) [32])((long)pvVar4 + lVar37 + (long)(iVar29 * 0x18) * 4 + lVar35) =
               auVar85;
          *(undefined1 (*) [32])((long)pvVar4 + lVar37 + (long)(iVar29 * 0x20) * 4 + lVar35) =
               auVar67;
          *(undefined1 (*) [32])((long)pvVar4 + lVar37 + (long)(iVar29 * 0x28) * 4 + lVar35) =
               auVar62;
          *(undefined1 (*) [32])((long)pvVar4 + lVar37 + (long)(iVar29 * 0x30) * 4 + lVar35) =
               auVar44;
          pfVar1 = (float *)((long)pvVar4 + lVar37 + (long)(iVar29 * 0x38) * 4 + lVar35);
          *pfVar1 = auVar24._0_4_ + auVar23._0_4_ * 5.25;
          pfVar1[1] = auVar24._4_4_ + auVar23._4_4_ * 5.25;
          pfVar1[2] = auVar24._8_4_ + auVar23._8_4_ * 5.25;
          pfVar1[3] = auVar24._12_4_ + auVar23._12_4_ * 5.25;
          pfVar1[4] = auVar24._16_4_ + auVar23._16_4_ * 5.25;
          pfVar1[5] = auVar24._20_4_ + auVar23._20_4_ * 5.25;
          pfVar1[6] = auVar24._24_4_ + auVar23._24_4_ * 5.25;
          pfVar1[7] = auVar24._28_4_ + auVar23._28_4_;
          lVar37 = lVar37 + (long)(iVar29 * 0x40) * 4;
        }
        lVar27 = lVar27 + 0x20;
      }
      local_8f0 = local_8f0 + (long)iVar25 * sVar3 * 6;
      lVar28 = lVar28 + (long)(int)uVar36 * 0x20;
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_input_pack8_avx(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 6;
    const int h_tiles = (h - 2) / 6;
    const int tiles = w_tiles * h_tiles;

    // const float itm[8][8] = {
    //     {1.0f,  0.0f, -5.25f,  0.00f,  5.25f,  0.00f, -1.0f, 0.0f},
    //
    //     {0.0f,  1.0f,  1.00f, -4.25f, -4.25f,  1.00f,  1.0f, 0.0f},
    //     {0.0f, -1.0f,  1.00f,  4.25f, -4.25f, -1.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  0.5f,  0.25f, -2.50f, -1.25f,  2.00f,  1.0f, 0.0f},
    //     {0.0f, -0.5f,  0.25f,  2.50f, -1.25f, -2.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  2.0f,  4.00f, -2.50f, -5.00f,  0.50f,  1.0f, 0.0f},
    //     {0.0f, -2.0f,  4.00f,  2.50f, -5.00f, -0.50f,  1.0f, 0.0f},
    //
    //     {0.0f, -1.0f,  0.00f,  5.25f,  0.00f, -5.25f,  0.0f, 1.0f}
    // };

    // 0 = r00 - r06 + (r04 - r02) * 5.25
    // 7 = r07 - r01 + (r03 - r05) * 5.25

    // 1 = (r02 + r06 - r04 * 4.25) + (r01 - r03 * 4.25 + r05)
    // 2 = (r02 + r06 - r04 * 4.25) - (r01 - r03 * 4.25 + r05)

    // 3 = (r06 + r02 * 0.25 - r04 * 1.25) + (r01 * 0.5 - r03 * 2.5 + r05 * 2)
    // 4 = (r06 + r02 * 0.25 - r04 * 1.25) - (r01 * 0.5 - r03 * 2.5 + r05 * 2)

    // reuse r04 * 1.25
    // reuse r03 * 2.5
    // 5 = (r06 + (r02 - r04 * 1.25) * 4) + (r01 * 2 - r03 * 2.5 + r05 * 0.5)
    // 6 = (r06 + (r02 - r04 * 1.25) * 4) - (r01 * 2 - r03 * 2.5 + r05 * 0.5)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

#ifdef _MSC_VER
        __declspec(align(32))
#else
        __attribute__((aligned(32)))
#endif
        float tmp[8][8][8];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 6) + (j * 6) * 8;

                for (int m = 0; m < 8; m++)
                {
                    __m256 _r00 = _mm256_load_ps(r0);
                    __m256 _r01 = _mm256_load_ps(r0 + 8);
                    __m256 _r02 = _mm256_load_ps(r0 + 16);
                    __m256 _r03 = _mm256_load_ps(r0 + 24);
                    __m256 _r04 = _mm256_load_ps(r0 + 32);
                    __m256 _r05 = _mm256_load_ps(r0 + 40);
                    __m256 _r06 = _mm256_load_ps(r0 + 48);
                    __m256 _r07 = _mm256_load_ps(r0 + 56);

                    __m256 _tmp0m = _mm256_comp_fmadd_ps(_mm256_set1_ps(5.25f), _mm256_sub_ps(_r04, _r02), _mm256_sub_ps(_r00, _r06));
                    __m256 _tmp7m = _mm256_comp_fmadd_ps(_mm256_set1_ps(5.25f), _mm256_sub_ps(_r03, _r05), _mm256_sub_ps(_r07, _r01));

                    __m256 _tmp12a = _mm256_comp_fmadd_ps(_mm256_set1_ps(-4.25f), _r04, _mm256_add_ps(_r02, _r06));
                    __m256 _tmp12b = _mm256_comp_fmadd_ps(_mm256_set1_ps(-4.25f), _r03, _mm256_add_ps(_r01, _r05));

                    __m256 _tmp1m = _mm256_add_ps(_tmp12a, _tmp12b);
                    __m256 _tmp2m = _mm256_sub_ps(_tmp12a, _tmp12b);

                    __m256 _tmp34a = _mm256_comp_fmadd_ps(_mm256_set1_ps(-1.25f), _r04, _mm256_comp_fmadd_ps(_mm256_set1_ps(0.25f), _r02, _r06));
                    __m256 _tmp34b = _mm256_comp_fmadd_ps(_mm256_set1_ps(2.f), _r05, _mm256_comp_fmadd_ps(_mm256_set1_ps(-2.5f), _r03, _mm256_mul_ps(_r01, _mm256_set1_ps(0.5f))));

                    __m256 _tmp3m = _mm256_add_ps(_tmp34a, _tmp34b);
                    __m256 _tmp4m = _mm256_sub_ps(_tmp34a, _tmp34b);

                    __m256 _tmp56a = _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _mm256_comp_fmadd_ps(_mm256_set1_ps(-1.25f), _r04, _r02), _r06);
                    __m256 _tmp56b = _mm256_comp_fmadd_ps(_mm256_set1_ps(0.5f), _r05, _mm256_comp_fmadd_ps(_mm256_set1_ps(-2.5f), _r03, _mm256_mul_ps(_r01, _mm256_set1_ps(2.f))));

                    __m256 _tmp5m = _mm256_add_ps(_tmp56a, _tmp56b);
                    __m256 _tmp6m = _mm256_sub_ps(_tmp56a, _tmp56b);

#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    // old gcc breaks stack variable alignement
                    // ref https://gcc.gnu.org/bugzilla/show_bug.cgi?id=16660
                    _mm256_storeu_ps(tmp[0][m], _tmp0m);
                    _mm256_storeu_ps(tmp[1][m], _tmp1m);
                    _mm256_storeu_ps(tmp[2][m], _tmp2m);
                    _mm256_storeu_ps(tmp[3][m], _tmp3m);
                    _mm256_storeu_ps(tmp[4][m], _tmp4m);
                    _mm256_storeu_ps(tmp[5][m], _tmp5m);
                    _mm256_storeu_ps(tmp[6][m], _tmp6m);
                    _mm256_storeu_ps(tmp[7][m], _tmp7m);
#else
                    _mm256_store_ps(tmp[0][m], _tmp0m);
                    _mm256_store_ps(tmp[1][m], _tmp1m);
                    _mm256_store_ps(tmp[2][m], _tmp2m);
                    _mm256_store_ps(tmp[3][m], _tmp3m);
                    _mm256_store_ps(tmp[4][m], _tmp4m);
                    _mm256_store_ps(tmp[5][m], _tmp5m);
                    _mm256_store_ps(tmp[6][m], _tmp6m);
                    _mm256_store_ps(tmp[7][m], _tmp7m);
#endif

                    r0 += w * 8;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j) * 8;
                float* r0_tm_1 = r0_tm_0 + tiles * 8;
                float* r0_tm_2 = r0_tm_0 + tiles * 16;
                float* r0_tm_3 = r0_tm_0 + tiles * 24;
                float* r0_tm_4 = r0_tm_0 + tiles * 32;
                float* r0_tm_5 = r0_tm_0 + tiles * 40;
                float* r0_tm_6 = r0_tm_0 + tiles * 48;
                float* r0_tm_7 = r0_tm_0 + tiles * 56;

                for (int m = 0; m < 8; m++)
                {
#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    __m256 _tmp00 = _mm256_loadu_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_loadu_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_loadu_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_loadu_ps(tmp[m][3]);
                    __m256 _tmp04 = _mm256_loadu_ps(tmp[m][4]);
                    __m256 _tmp05 = _mm256_loadu_ps(tmp[m][5]);
                    __m256 _tmp06 = _mm256_loadu_ps(tmp[m][6]);
                    __m256 _tmp07 = _mm256_loadu_ps(tmp[m][7]);
#else
                    __m256 _tmp00 = _mm256_load_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_load_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_load_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_load_ps(tmp[m][3]);
                    __m256 _tmp04 = _mm256_load_ps(tmp[m][4]);
                    __m256 _tmp05 = _mm256_load_ps(tmp[m][5]);
                    __m256 _tmp06 = _mm256_load_ps(tmp[m][6]);
                    __m256 _tmp07 = _mm256_load_ps(tmp[m][7]);
#endif

                    __m256 _r0tm0 = _mm256_comp_fmadd_ps(_mm256_set1_ps(5.25f), _mm256_sub_ps(_tmp04, _tmp02), _mm256_sub_ps(_tmp00, _tmp06));
                    __m256 _r0tm7 = _mm256_comp_fmadd_ps(_mm256_set1_ps(5.25f), _mm256_sub_ps(_tmp03, _tmp05), _mm256_sub_ps(_tmp07, _tmp01));

                    __m256 _tmp12a = _mm256_comp_fmadd_ps(_mm256_set1_ps(-4.25f), _tmp04, _mm256_add_ps(_tmp02, _tmp06));
                    __m256 _tmp12b = _mm256_comp_fmadd_ps(_mm256_set1_ps(-4.25f), _tmp03, _mm256_add_ps(_tmp01, _tmp05));

                    __m256 _r0tm1 = _mm256_add_ps(_tmp12a, _tmp12b);
                    __m256 _r0tm2 = _mm256_sub_ps(_tmp12a, _tmp12b);

                    __m256 _tmp34a = _mm256_comp_fmadd_ps(_mm256_set1_ps(-1.25f), _tmp04, _mm256_comp_fmadd_ps(_mm256_set1_ps(0.25f), _tmp02, _tmp06));
                    __m256 _tmp34b = _mm256_comp_fmadd_ps(_mm256_set1_ps(2.f), _tmp05, _mm256_comp_fmadd_ps(_mm256_set1_ps(-2.5f), _tmp03, _mm256_mul_ps(_tmp01, _mm256_set1_ps(0.5f))));

                    __m256 _r0tm3 = _mm256_add_ps(_tmp34a, _tmp34b);
                    __m256 _r0tm4 = _mm256_sub_ps(_tmp34a, _tmp34b);

                    __m256 _tmp56a = _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _mm256_comp_fmadd_ps(_mm256_set1_ps(-1.25f), _tmp04, _tmp02), _tmp06);
                    __m256 _tmp56b = _mm256_comp_fmadd_ps(_mm256_set1_ps(0.5f), _tmp05, _mm256_comp_fmadd_ps(_mm256_set1_ps(-2.5f), _tmp03, _mm256_mul_ps(_tmp01, _mm256_set1_ps(2.f))));

                    __m256 _r0tm5 = _mm256_add_ps(_tmp56a, _tmp56b);
                    __m256 _r0tm6 = _mm256_sub_ps(_tmp56a, _tmp56b);

                    _mm256_store_ps(r0_tm_0, _r0tm0);
                    _mm256_store_ps(r0_tm_1, _r0tm1);
                    _mm256_store_ps(r0_tm_2, _r0tm2);
                    _mm256_store_ps(r0_tm_3, _r0tm3);
                    _mm256_store_ps(r0_tm_4, _r0tm4);
                    _mm256_store_ps(r0_tm_5, _r0tm5);
                    _mm256_store_ps(r0_tm_6, _r0tm6);
                    _mm256_store_ps(r0_tm_7, _r0tm7);

                    r0_tm_0 += tiles * 64;
                    r0_tm_1 += tiles * 64;
                    r0_tm_2 += tiles * 64;
                    r0_tm_3 += tiles * 64;
                    r0_tm_4 += tiles * 64;
                    r0_tm_5 += tiles * 64;
                    r0_tm_6 += tiles * 64;
                    r0_tm_7 += tiles * 64;
                }
            }
        }
    }
}